

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

bool Fossilize::find_extension
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *exts,
               char *ext)

{
  VkExtensionProperties *pVVar1;
  bool bVar2;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  __it;
  long lVar3;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  _Var4;
  long lVar5;
  char **local_40;
  char *local_38;
  
  local_40 = &local_38;
  __it._M_current =
       (exts->super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (exts->super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pVVar1 - (long)__it._M_current;
  local_38 = ext;
  for (lVar3 = lVar5 / 0x104 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                          *)&local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_0016730b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                          *)&local_40,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0016730b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                          *)&local_40,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0016730b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                          *)&local_40,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0016730b;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x410;
  }
  lVar5 = lVar5 / 0x104;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = pVVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::$_0>
                  ::operator()((_Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                                *)&local_40,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_0016730b;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::$_0>
            ::operator()((_Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                          *)&local_40,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_0016730b;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::$_0>
          ::operator()((_Iter_pred<Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                        *)&local_40,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = pVVar1;
  }
LAB_0016730b:
  return _Var4._M_current != pVVar1;
}

Assistant:

static bool find_extension(const vector<VkExtensionProperties> &exts, const char *ext)
{
	auto itr = find_if(begin(exts), end(exts), [&](const VkExtensionProperties &prop) -> bool {
		return strcmp(ext, prop.extensionName) == 0;
	});
	return itr != end(exts);
}